

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LzFind.c
# Opt level: O3

void SkipMatchesSpec(UInt32 lenLimit,UInt32 curMatch,UInt32 pos,Byte *cur,CLzRef *son,
                    UInt32 _cyclicBufferPos,UInt32 _cyclicBufferSize,UInt32 cutValue)

{
  byte bVar1;
  byte bVar2;
  UInt32 UVar3;
  uint uVar4;
  uint uVar5;
  ulong uVar6;
  uint uVar7;
  uint uVar8;
  UInt32 *pUVar9;
  UInt32 *local_40;
  UInt32 *local_38;
  
  local_40 = son + _cyclicBufferPos * 2;
  local_38 = son + (ulong)(_cyclicBufferPos * 2) + 1;
  uVar8 = pos - curMatch;
  if (uVar8 < _cyclicBufferSize && cutValue != 0) {
    uVar4 = 0;
    uVar7 = 0;
    do {
      UVar3 = 0;
      if (_cyclicBufferPos < uVar8) {
        UVar3 = _cyclicBufferSize;
      }
      uVar5 = uVar4;
      if (uVar7 < uVar4) {
        uVar5 = uVar7;
      }
      uVar6 = (ulong)uVar5;
      pUVar9 = son + ((_cyclicBufferPos - uVar8) + UVar3) * 2;
      bVar1 = cur[uVar6];
      bVar2 = cur[uVar6 - uVar8];
      while (uVar5 = (uint)uVar6, bVar2 == bVar1) {
        if (lenLimit - 1 == uVar5) {
          *local_40 = *pUVar9;
          UVar3 = pUVar9[1];
          goto LAB_00114b73;
        }
        uVar6 = (ulong)(uVar5 + 1);
        bVar1 = cur[uVar6];
        bVar2 = cur[uVar6 - uVar8];
      }
      if (bVar2 < bVar1) {
        *local_40 = curMatch;
        pUVar9 = pUVar9 + 1;
        uVar4 = uVar5;
        local_40 = pUVar9;
      }
      else {
        *local_38 = curMatch;
        uVar7 = uVar5;
        local_38 = pUVar9;
      }
      cutValue = cutValue - 1;
      if (cutValue == 0) break;
      curMatch = *pUVar9;
      uVar8 = pos - curMatch;
    } while (uVar8 < _cyclicBufferSize);
  }
  *local_40 = 0;
  UVar3 = 0;
LAB_00114b73:
  *local_38 = UVar3;
  return;
}

Assistant:

static void SkipMatchesSpec(UInt32 lenLimit, UInt32 curMatch, UInt32 pos, const Byte *cur, CLzRef *son,
    UInt32 _cyclicBufferPos, UInt32 _cyclicBufferSize, UInt32 cutValue)
{
  CLzRef *ptr0 = son + (_cyclicBufferPos << 1) + 1;
  CLzRef *ptr1 = son + (_cyclicBufferPos << 1);
  UInt32 len0 = 0, len1 = 0;
  for (;;)
  {
    UInt32 delta = pos - curMatch;
    if (cutValue-- == 0 || delta >= _cyclicBufferSize)
    {
      *ptr0 = *ptr1 = kEmptyHashValue;
      return;
    }
    {
      CLzRef *pair = son + ((_cyclicBufferPos - delta + ((delta > _cyclicBufferPos) ? _cyclicBufferSize : 0)) << 1);
      const Byte *pb = cur - delta;
      UInt32 len = (len0 < len1 ? len0 : len1);
      if (pb[len] == cur[len])
      {
        while (++len != lenLimit)
          if (pb[len] != cur[len])
            break;
        {
          if (len == lenLimit)
          {
            *ptr1 = pair[0];
            *ptr0 = pair[1];
            return;
          }
        }
      }
      if (pb[len] < cur[len])
      {
        *ptr1 = curMatch;
        ptr1 = pair + 1;
        curMatch = *ptr1;
        len1 = len;
      }
      else
      {
        *ptr0 = curMatch;
        ptr0 = pair;
        curMatch = *ptr0;
        len0 = len;
      }
    }
  }
}